

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O0

int filevisit(int f,int n)

{
  int iVar1;
  char *pcVar2;
  buffer *bp_00;
  int status;
  char *adjf;
  char *bufp;
  char fname [1024];
  buffer *bp;
  int n_local;
  int f_local;
  
  iVar1 = getbufcwd((char *)&bufp,0x400);
  if (iVar1 != 1) {
    bufp._0_1_ = 0;
  }
  pcVar2 = eread("Find file: ",(char *)&bufp,0x400,0x3c);
  if (pcVar2 == (char *)0x0) {
    n_local = 2;
  }
  else if (*pcVar2 == '\0') {
    n_local = 0;
  }
  else {
    pcVar2 = adjustname((char *)&bufp,1);
    if (pcVar2 == (char *)0x0) {
      n_local = 0;
    }
    else {
      iVar1 = fisdir(pcVar2);
      if (iVar1 == 1) {
        n_local = do_dired(pcVar2);
      }
      else {
        bp_00 = findbuffer(pcVar2);
        if (bp_00 == (buffer *)0x0) {
          n_local = 0;
        }
        else {
          curbp = bp_00;
          iVar1 = showbuffer(bp_00,curwp,8);
          if (iVar1 == 1) {
            if (bp_00->b_fname[0] == '\0') {
              n_local = readin(pcVar2);
              if (n_local != 1) {
                killbuffer(bp_00);
              }
            }
            else {
              n_local = 1;
            }
          }
          else {
            n_local = 0;
          }
        }
      }
    }
  }
  return n_local;
}

Assistant:

int
filevisit(int f, int n)
{
	struct buffer	*bp;
	char	 fname[NFILEN], *bufp, *adjf;
	int	 status;

	if (getbufcwd(fname, sizeof(fname)) != TRUE)
		fname[0] = '\0';
	bufp = eread("Find file: ", fname, NFILEN,
	    EFNEW | EFCR | EFFILE | EFDEF);
	if (bufp == NULL)
		return (ABORT);
	else if (bufp[0] == '\0')
		return (FALSE);
	adjf = adjustname(fname, TRUE);
	if (adjf == NULL)
		return (FALSE);
	if (fisdir(adjf) == TRUE)
		return (do_dired(adjf));
	if ((bp = findbuffer(adjf)) == NULL)
		return (FALSE);
	curbp = bp;
	if (showbuffer(bp, curwp, WFFULL) != TRUE)
		return (FALSE);
	if (bp->b_fname[0] == '\0') {
		if ((status = readin(adjf)) != TRUE)
			killbuffer(bp);
		return (status);
	}
	return (TRUE);
}